

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadratictetra.cpp
# Opt level: O0

void pzgeom::TPZQuadraticTetra::TShape<double>
               (TPZVec<double> *par,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  TPZVec<double> *in_RDI;
  double col;
  double row;
  TPZFMatrix<double> *this;
  double zeta;
  double eta;
  double qsi;
  int64_t in_stack_fffffffffffffef0;
  int64_t in_stack_fffffffffffffef8;
  TPZFMatrix<double> *in_stack_ffffffffffffff00;
  
  pdVar4 = TPZVec<double>::operator[](in_RDI,0);
  dVar1 = *pdVar4;
  pdVar4 = TPZVec<double>::operator[](in_RDI,1);
  dVar2 = *pdVar4;
  pdVar4 = TPZVec<double>::operator[](in_RDI,2);
  dVar3 = *pdVar4;
  pdVar4 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0)
  ;
  *pdVar4 = ((dVar3 + dVar2 + dVar1) - 1.0) * ((dVar1 + dVar1 + dVar3 + dVar3 + dVar2 * 2.0) - 1.0);
  pdVar4 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0)
  ;
  *pdVar4 = dVar1 * (dVar1 + dVar1 + -1.0);
  pdVar4 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0)
  ;
  *pdVar4 = dVar2 * (dVar2 + dVar2 + -1.0);
  col = dVar3 * (dVar3 + dVar3 + -1.0);
  pdVar4 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int64_t)col);
  *pdVar4 = col;
  row = dVar1 * -4.0 * ((dVar1 + dVar2 + dVar3) - 1.0);
  pdVar4 = TPZFMatrix<double>::operator()(in_stack_ffffffffffffff00,(int64_t)row,(int64_t)col);
  *pdVar4 = row;
  this = (TPZFMatrix<double> *)(dVar1 * 4.0 * dVar2);
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = (double)this;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar2 * -4.0 * ((dVar1 + dVar2 + dVar3) - 1.0);
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar3 * -4.0 * ((dVar1 + dVar2 + dVar3) - 1.0);
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar1 * 4.0 * dVar3;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar2 * 4.0 * dVar3;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar3 * 4.0 + dVar2 * 4.0 + dVar1 * 4.0 + -3.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar3 * 4.0 + dVar2 * 4.0 + dVar1 * 4.0 + -3.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar3 * 4.0 + dVar2 * 4.0 + dVar1 * 4.0 + -3.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar1 * 4.0 + -1.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = 0.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = 0.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = 0.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar2 * 4.0 + -1.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = 0.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = 0.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = 0.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar3 * 4.0 + -1.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = ((dVar1 + dVar1 + dVar2 + dVar3) - 1.0) * -4.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar1 * -4.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar1 * -4.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar2 * 4.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar1 * 4.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = 0.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar2 * -4.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = ((dVar1 + dVar2 + dVar3) - 1.0) * -4.0 + -(dVar2 * 4.0);
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar2 * -4.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar3 * -4.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar3 * -4.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = ((dVar1 + dVar2 + dVar3) - 1.0) * -4.0 + -(dVar3 * 4.0);
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar3 * 4.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = 0.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar1 * 4.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = 0.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar3 * 4.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar2 * 4.0;
  return;
}

Assistant:

void TPZQuadraticTetra::TShape(const TPZVec<T> &par, TPZFMatrix<T> &phi, TPZFMatrix<T> &dphi)
{
	T qsi = par[0], eta = par[1], zeta = par[2];
	
    phi(0,0)  =  (zeta + eta + qsi -1.) * (2.*zeta + 2.*eta + 2.*qsi - 1.);
//    phi(0,0)  =  (qsi + eta + zeta -1.) * (2.*qsi + 2.*eta + 2.*zeta - 1.);
//    phi(0,0)  =  2.*qsi*qsi + 2.*eta*eta + 2.*zeta*zeta + 4.*qsi*eta + 4.*qsi*zeta + 4.*eta*zeta - 3.*qsi - 3.*eta - 3.*zeta + 1.;
	phi(1,0)  =  qsi  * (2.*qsi - 1.);
	phi(2,0)  =  eta  * (2.*eta - 1.);
	phi(3,0)  =  zeta * (2.*zeta - 1.);
	phi(4,0)  = -4.*qsi  * (qsi + eta + zeta -1.);
	phi(5,0)  =  4.*qsi  *  eta;
	phi(6,0)  = -4.*eta  * (qsi + eta + zeta -1.);
	phi(7,0)  = -4.*zeta * (qsi + eta + zeta -1.);
	phi(8,0)  =  4.*qsi  *  zeta;
	phi(9,0)  =  4.*eta  *  zeta;
	
	dphi(0,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(1,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(2,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(0,1) =  -1. + 4.*qsi;
	dphi(1,1) =   0.;
	dphi(2,1) =   0.;
	dphi(0,2) =   0.;
	dphi(1,2) =  -1. + 4.*eta;
	dphi(2,2) =   0.;
	dphi(0,3) =   0.;
	dphi(1,3) =   0.;
	dphi(2,3) =  -1. + 4.*zeta;
	dphi(0,4) =  -4.*(2.*qsi + eta + zeta - 1.);
	dphi(1,4) =  -4.*qsi;
	dphi(2,4) =  -4.*qsi;
	dphi(0,5) =   4.*eta;
	dphi(1,5) =   4.*qsi;
	dphi(2,5) =   0.;
	dphi(0,6) =  -4.*eta;
	dphi(1,6) =  -4.*(qsi + eta + zeta - 1.)-4.*eta;
	dphi(2,6) =  -4.*eta;
	dphi(0,7) =  -4.*zeta;
	dphi(1,7) =  -4.*zeta;
	dphi(2,7) =  -4.*(qsi + eta + zeta - 1.)-4.*zeta;
	dphi(0,8) =   4.*zeta;
	dphi(1,8) =   0.;
	dphi(2,8) =   4.*qsi;
	dphi(0,9) =   0.;
	dphi(1,9) =   4.*zeta;
	dphi(2,9) =   4.*eta;
}